

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeConst(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  HeapType HVar2;
  TupleMake *pTVar3;
  Type *pTVar4;
  uintptr_t *puVar5;
  undefined1 this_00 [8];
  Iterator IVar6;
  Literal local_90;
  Expression *local_78;
  Type *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  undefined1 local_48 [8];
  Iterator __begin3;
  Type type_local;
  
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = type.id;
  if ((type.id & 1) == 0 && 6 < type.id) {
    if (((this->wasm->features).features & 0x100) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd39,"Expression *wasm::TranslateToFuzzReader::makeConst(Type)");
    }
    if (((type.id & 2) == 0) || (bVar1 = Random::oneIn(&this->random,8), !bVar1)) {
      auStack_68 = (undefined1  [8])
                   Type::getHeapType((Type *)&__begin3.
                                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                              .index);
      bVar1 = HeapType::isString((HeapType *)auStack_68);
      if (bVar1) {
        pTVar3 = (TupleMake *)makeStringConst(this);
      }
      else {
        HVar2 = Type::getHeapType((Type *)&__begin3.
                                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .index);
        if (HVar2.id < 0x7d) {
          pTVar3 = (TupleMake *)
                   makeBasicRef(this,(Type)__begin3.
                                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .index);
        }
        else {
          pTVar3 = (TupleMake *)
                   makeCompoundRef(this,(Type)__begin3.
                                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                              .index);
        }
      }
    }
    else {
      HVar2 = Type::getHeapType((Type *)&__begin3.
                                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         .index);
      pTVar3 = (TupleMake *)Builder::makeRefNull(&this->builder,HVar2);
    }
  }
  else if ((type.id & 1) == 0 || type.id < 7) {
    if (6 < type.id) {
      __assert_fail("type.isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd4d,"Expression *wasm::TranslateToFuzzReader::makeConst(Type)");
    }
    makeLiteral(&local_90,this,type);
    pTVar3 = (TupleMake *)Builder::makeConst(&this->builder,&local_90);
    ::wasm::Literal::~Literal(&local_90);
  }
  else {
    auStack_68 = (undefined1  [8])0x0;
    operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = (undefined1  [8])
              &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_48 = this_00;
    IVar6 = Type::end((Type *)this_00);
    local_70 = IVar6.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    pTVar4 = (Type *)0x0;
    while ((pTVar4 != (Type *)IVar6.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index || (this_00 != (undefined1  [8])local_70))) {
      puVar5 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_48);
      local_78 = makeConst(this,(Type)*puVar5);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,&local_78
                );
      pTVar4 = (Type *)((long)&(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
      this_00 = local_48;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar4;
    }
    pTVar3 = Builder::
             makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (&this->builder,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_68);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68);
  }
  return (Expression *)pTVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeConst(Type type) {
  if (type.isRef()) {
    assert(wasm.features.hasReferenceTypes());
    // With a low chance, just emit a null if that is valid.
    if (type.isNullable() && oneIn(8)) {
      return builder.makeRefNull(type.getHeapType());
    }
    if (type.getHeapType().isString()) {
      return makeStringConst();
    }
    if (type.getHeapType().isBasic()) {
      return makeBasicRef(type);
    } else {
      return makeCompoundRef(type);
    }
  } else if (type.isTuple()) {
    std::vector<Expression*> operands;
    for (const auto& t : type) {
      operands.push_back(makeConst(t));
    }
    return builder.makeTupleMake(std::move(operands));
  } else {
    assert(type.isBasic());
    return builder.makeConst(makeLiteral(type));
  }
}